

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall DirectChainedMap<TypeFunction_*>::rehash(DirectChainedMap<TypeFunction_*> *this)

{
  uint uVar1;
  Node *pNVar2;
  int iVar3;
  undefined4 extraout_var;
  Node *start_00;
  Node *start;
  uint i;
  Node *oldData;
  uint oldBucketCount;
  DirectChainedMap<TypeFunction_*> *this_local;
  
  uVar1 = this->bucketCount;
  pNVar2 = this->data;
  this->bucketCount = this->bucketCount << 1;
  this->count = 0;
  iVar3 = (*this->allocator->_vptr_Allocator[2])();
  this->data = (Node *)CONCAT44(extraout_var,iVar3);
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount * 0x18);
  for (start._4_4_ = 0; start._4_4_ < uVar1; start._4_4_ = start._4_4_ + 1) {
    start_00 = pNVar2 + (ulong)start._4_4_ * 0x18;
    if (*(long *)(start_00 + 0x10) != 0) {
      rehash_insert_reverse(this,start_00,start_00);
    }
  }
  (*this->allocator->_vptr_Allocator[3])(this->allocator,pNVar2);
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;
		count = 0;

		data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node *start = &oldData[i];

			if(start->next == NULL)
				continue;

			rehash_insert_reverse(start, start);
		}

		allocator->dealloc(oldData);
	}